

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
jessilib::string_cast<char,char32_t[2]>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,jessilib *this,char32_t (*in_string) [2])

{
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_string_00;
  bool bVar1;
  decode_result dVar2;
  decode_result string_front;
  undefined1 auStack_48 [8];
  InViewT in_string_view;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> result;
  char32_t (*in_string_local) [2];
  
  std::__cxx11::string::string((string *)&in_string_view._M_str);
  std::basic_string_view<char32_t,_std::char_traits<char32_t>_>::basic_string_view
            ((basic_string_view<char32_t,_std::char_traits<char32_t>_> *)auStack_48,(char32_t *)this
            );
  std::basic_string_view<char32_t,_std::char_traits<char32_t>_>::size
            ((basic_string_view<char32_t,_std::char_traits<char32_t>_> *)auStack_48);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &in_string_view._M_str,0);
  do {
    bVar1 = std::basic_string_view<char32_t,_std::char_traits<char32_t>_>::empty
                      ((basic_string_view<char32_t,_std::char_traits<char32_t>_> *)auStack_48);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &in_string_view._M_str);
LAB_003d2488:
      std::__cxx11::string::~string((string *)&in_string_view._M_str);
      return __return_storage_ptr__;
    }
    in_string_00._M_str = (char32_t *)in_string_view._M_len;
    in_string_00._M_len = (size_t)auStack_48;
    dVar2 = decode_codepoint<char32_t>(in_string_00);
    if (dVar2.units == 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      goto LAB_003d2488;
    }
    std::basic_string_view<char32_t,_std::char_traits<char32_t>_>::remove_prefix
              ((basic_string_view<char32_t,_std::char_traits<char32_t>_> *)auStack_48,dVar2.units);
    encode_codepoint<char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &in_string_view._M_str,dVar2.codepoint);
  } while( true );
}

Assistant:

std::basic_string<OutCharT> string_cast(const InT& in_string) {
	static_assert(impl_unicode::is_string<InT>::value == true);
	using InCharT = std::remove_cvref_t<typename impl_unicode::is_string<InT>::type>;
	using InEquivalentT = typename unicode_traits<InCharT>::equivalent_type;
	using InViewT = std::basic_string_view<InCharT>;
	using OutT = std::basic_string<OutCharT>;

	if constexpr (std::is_same_v<InT, OutT>) {
		// This does nothing at all; consider static_assert against this?
		return in_string;
	}
	else if constexpr (std::is_same_v<OutCharT, InCharT>
	    || std::is_same_v<OutCharT, InEquivalentT>) {
		// Just do a dumb copy when same or equivalent char types; should be faster than re-encoding
		if constexpr (impl_unicode::is_string<InT>::is_container) {
			return { reinterpret_cast<const OutCharT*>(in_string.data()), in_string.size() };
		}
		else if constexpr (impl_unicode::is_string<InT>::is_fixed_array) {
			return { reinterpret_cast<const OutCharT*>(in_string), std::size(in_string) - 1 }; // strip null term
		}
		else {
			return { reinterpret_cast<const OutCharT*>(in_string) };
		}
	}
	else {
		// Last resort: reencode the string
		std::basic_string<OutCharT> result;
		InViewT in_string_view = static_cast<InViewT>(in_string);
		if constexpr (sizeof(InCharT) <= sizeof(OutCharT)) {
			// When copying to a larger type, we will need _at most_ as many elements as the smaller storage type
			result.reserve(in_string_view.size());
		}
		else {
			result.reserve(in_string_view.size() * (sizeof(OutCharT) / sizeof(InCharT)));
		}

		while (!in_string_view.empty()) {
			decode_result string_front = decode_codepoint(in_string_view);
			if (string_front.units == 0) {
				return {};
			}
			in_string_view.remove_prefix(string_front.units);

			encode_codepoint(result, string_front.codepoint);
		}

		return result;
	}
}